

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.y
# Opt level: O3

TypeSpecifiers * __thiscall CParse::addTypeSpecifier(CParse *this,TypeSpecifiers *spec,Datatype *tp)

{
  string local_48;
  
  if (spec->type_specifier != (Datatype *)0x0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Multiple type specifiers","");
    setError(this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  spec->type_specifier = tp;
  return spec;
}

Assistant:

TypeSpecifiers *CParse::addTypeSpecifier(TypeSpecifiers *spec,Datatype *tp)

{
  if (spec->type_specifier!=(Datatype *)0)
    setError("Multiple type specifiers");
  spec->type_specifier = tp;
  return spec;
}